

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockCallTest_OnObjectExpectedButNotCalled_Test::testBody
          (TEST_MockCallTest_OnObjectExpectedButNotCalled_Test *this)

{
  int iVar1;
  MockCheckedExpectedCall *pMVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *test;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest expectations;
  MockExpectedObjectDidntHappenFailure expectedFailure;
  MockFailureReporterInstaller local_91;
  SimpleString local_90;
  MockExpectedCallsList local_80;
  TestFailure local_70;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_91);
  MockExpectedCallsList::MockExpectedCallsList(&local_80);
  local_80._vptr_MockExpectedCallsList = (_func_int **)&PTR__MockExpectedCallsListForTest_002aa030;
  SimpleString::SimpleString((SimpleString *)&local_70,"boo");
  pMVar2 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)&local_80,(SimpleString *)&local_70);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0x24])(pMVar2,1);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  SimpleString::SimpleString((SimpleString *)&local_70,"boo");
  pMVar2 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)&local_80,(SimpleString *)&local_70);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0x24])(pMVar2,1);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  SimpleString::SimpleString((SimpleString *)&local_70,"");
  pMVar3 = mock((SimpleString *)&local_70,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"boo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_90);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x120))
            ((long *)CONCAT44(extraout_var,iVar1),1);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  SimpleString::SimpleString((SimpleString *)&local_70,"");
  pMVar3 = mock((SimpleString *)&local_70,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"boo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_90);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x120))
            ((long *)CONCAT44(extraout_var_00,iVar1),1);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  SimpleString::SimpleString((SimpleString *)&local_70,"");
  pMVar3 = mock((SimpleString *)&local_70,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"boo");
  (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_90);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  SimpleString::SimpleString((SimpleString *)&local_70,"");
  pMVar3 = mock((SimpleString *)&local_70,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"boo");
  (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_90);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_90,"boo");
  MockExpectedObjectDidntHappenFailure::MockExpectedObjectDidntHappenFailure
            ((MockExpectedObjectDidntHappenFailure *)&local_70,test,&local_90,&local_80);
  SimpleString::~SimpleString(&local_90);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x1af);
  SimpleString::SimpleString(&local_90,"");
  pMVar3 = mock(&local_90,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x25])(pMVar3);
  SimpleString::~SimpleString(&local_90);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x1b1);
  TestFailure::~TestFailure(&local_70);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_80);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_91);
  return;
}

Assistant:

TEST(MockCallTest, OnObjectExpectedButNotCalled)
{
    MockFailureReporterInstaller failureReporterInstaller;

    void* objectPtr = (void*) 0x001;
    MockExpectedCallsListForTest expectations;
    expectations.addFunction("boo")->onObject(objectPtr);
    expectations.addFunction("boo")->onObject(objectPtr);

    mock().expectOneCall("boo").onObject(objectPtr);
    mock().expectOneCall("boo").onObject(objectPtr);
    mock().actualCall("boo");
    mock().actualCall("boo");

    MockExpectedObjectDidntHappenFailure expectedFailure(mockFailureTest(), "boo", expectations);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}